

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_utility.cpp
# Opt level: O1

void __thiscall FNodeBuilder::AddSegToBBox(FNodeBuilder *this,fixed_t *bbox,FPrivSeg *seg)

{
  FPrivVert *pFVar1;
  int iVar2;
  int iVar3;
  FPrivVert *pFVar4;
  
  pFVar4 = (this->Vertices).Array;
  pFVar1 = pFVar4 + seg->v1;
  iVar2 = seg->v2;
  iVar3 = pFVar4[seg->v1].super_FSimpleVert.x;
  if (iVar3 < bbox[2]) {
    bbox[2] = iVar3;
  }
  iVar3 = (pFVar1->super_FSimpleVert).x;
  if (bbox[3] < iVar3) {
    bbox[3] = iVar3;
  }
  iVar3 = (pFVar1->super_FSimpleVert).y;
  if (iVar3 < bbox[1]) {
    bbox[1] = iVar3;
  }
  pFVar4 = pFVar4 + iVar2;
  iVar2 = (pFVar1->super_FSimpleVert).y;
  if (*bbox < iVar2) {
    *bbox = iVar2;
  }
  iVar2 = (pFVar4->super_FSimpleVert).x;
  if (iVar2 < bbox[2]) {
    bbox[2] = iVar2;
  }
  iVar2 = (pFVar4->super_FSimpleVert).x;
  if (bbox[3] < iVar2) {
    bbox[3] = iVar2;
  }
  iVar2 = (pFVar4->super_FSimpleVert).y;
  if (iVar2 < bbox[1]) {
    bbox[1] = iVar2;
  }
  iVar2 = (pFVar4->super_FSimpleVert).y;
  if (*bbox < iVar2) {
    *bbox = iVar2;
  }
  return;
}

Assistant:

void FNodeBuilder::AddSegToBBox (fixed_t bbox[4], const FPrivSeg *seg)
{
	FPrivVert *v1 = &Vertices[seg->v1];
	FPrivVert *v2 = &Vertices[seg->v2];

	if (v1->x < bbox[BOXLEFT])		bbox[BOXLEFT] = v1->x;
	if (v1->x > bbox[BOXRIGHT])		bbox[BOXRIGHT] = v1->x;
	if (v1->y < bbox[BOXBOTTOM])	bbox[BOXBOTTOM] = v1->y;
	if (v1->y > bbox[BOXTOP])		bbox[BOXTOP] = v1->y;

	if (v2->x < bbox[BOXLEFT])		bbox[BOXLEFT] = v2->x;
	if (v2->x > bbox[BOXRIGHT])		bbox[BOXRIGHT] = v2->x;
	if (v2->y < bbox[BOXBOTTOM])	bbox[BOXBOTTOM] = v2->y;
	if (v2->y > bbox[BOXTOP])		bbox[BOXTOP] = v2->y;
}